

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O1

int Ivy_ManIsAcyclic(Ivy_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  char *pcVar4;
  long lVar5;
  
  Ivy_ManIncrementTravId(p);
  Ivy_ManIncrementTravId(p);
  pVVar3 = p->vObjs;
  if (pVVar3->nSize < 1) {
    iVar2 = 1;
  }
  else {
    iVar2 = 1;
    lVar5 = 0;
    do {
      puVar1 = (uint *)pVVar3->pArray[lVar5];
      if ((puVar1 != (uint *)0x0) &&
         ((((puVar1[2] & 0xf) == 4 || ((puVar1[2] & 0xf) == 2)) &&
          (iVar2 = Ivy_ManIsAcyclic_rec
                             (p,(Ivy_Obj_t *)(*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe)),
          iVar2 == 0)))) {
        pcVar4 = "PO";
        if ((puVar1[2] & 0xf) == 4) {
          pcVar4 = "latch";
        }
        fprintf(_stdout," (cone of %s \"%d\")\n",pcVar4,(ulong)*puVar1);
        return 0;
      }
      lVar5 = lVar5 + 1;
      pVVar3 = p->vObjs;
    } while (lVar5 < pVVar3->nSize);
  }
  return iVar2;
}

Assistant:

int Ivy_ManIsAcyclic( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int fAcyclic, i;
    // set the traversal ID for this DFS ordering
    Ivy_ManIncrementTravId( p );   
    Ivy_ManIncrementTravId( p );   
    // pObj->TravId == pNet->nTravIds      means "pObj is on the path"
    // pObj->TravId == pNet->nTravIds - 1  means "pObj is visited but is not on the path"
    // pObj->TravId <  pNet->nTravIds - 1  means "pObj is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Ivy_ManForEachCo( p, pObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Ivy_ManIsAcyclic_rec(p, Ivy_ObjFanin0(pObj))) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, " (cone of %s \"%d\")\n", Ivy_ObjIsLatch(pObj)? "latch" : "PO", Ivy_ObjId(pObj) );
        break;
    }
    return fAcyclic;
}